

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<char>>::bin_writer<3>>
::operator()(padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::int_writer<unsigned_long,_fmt::v5::basic_format_specs<char>_>::bin_writer<3>_>
             *this,char **it)

{
  size_t sVar1;
  char *pcVar2;
  char *in_RSI;
  basic_string_view<char> *in_RDI;
  char *unaff_retaddr;
  char *in_stack_00000008;
  char **in_stack_ffffffffffffffd8;
  bin_writer<3> *in_stack_ffffffffffffffe0;
  basic_string_view<char> *__result;
  
  __result = in_RDI;
  sVar1 = basic_string_view<char>::size(in_RDI);
  if (sVar1 != 0) {
    in_stack_ffffffffffffffe0 = (bin_writer<3> *)basic_string_view<char>::data(in_RDI);
    basic_string_view<char>::size(in_RDI);
    pcVar2 = std::copy_n<char_const*,unsigned_long,char*>
                       (in_stack_00000008,(unsigned_long)unaff_retaddr,(char *)__result);
    *(char **)in_RSI = pcVar2;
  }
  pcVar2 = std::fill_n<char*,unsigned_long,char>(unaff_retaddr,(unsigned_long)__result,in_RSI);
  *(char **)in_RSI = pcVar2;
  int_writer<unsigned_long,fmt::v5::basic_format_specs<char>>::bin_writer<3>::operator()
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void operator()(It &&it) const {
      if (prefix.size() != 0)
        it = std::copy_n(prefix.data(), prefix.size(), it);
      it = std::fill_n(it, padding, fill);
      f(it);
    }